

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O0

bool __thiscall xmrig::OclBackend::isEnabled(OclBackend *this,Algorithm *algorithm)

{
  bool bVar1;
  Config *this_00;
  OclConfig *this_01;
  long in_RDI;
  Threads<xmrig::OclThreads> *in_stack_00000020;
  
  this_00 = Base::config((Base *)**(undefined8 **)(in_RDI + 8));
  this_01 = Config::cl(this_00);
  OclConfig::threads(this_01);
  Threads<xmrig::OclThreads>::get(in_stack_00000020);
  bVar1 = OclThreads::isEmpty((OclThreads *)0x20a65f);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool xmrig::OclBackend::isEnabled(const Algorithm &algorithm) const
{
    return !d_ptr->controller->config()->cl().threads().get().isEmpty();
}